

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

char __thiscall smf::Options::getChar(Options *this,string *optionName)

{
  char cVar1;
  char *pcVar2;
  undefined1 local_38 [40];
  string *optionName_local;
  Options *this_local;
  
  local_38._32_8_ = optionName;
  optionName_local = (string *)this;
  getString((Options *)local_38,(string *)this);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cVar1 = *pcVar2;
  std::__cxx11::string::~string((string *)local_38);
  return cVar1;
}

Assistant:

char Options::getChar(const std::string& optionName) {
   return getString(optionName).c_str()[0];
}